

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtypes.c
# Opt level: O2

void ByteRateToString(tchar_t *Out,size_t OutLen,int ByteRate)

{
  ulong uVar1;
  char *In;
  cc_fraction f;
  
  uVar1 = (long)ByteRate / 0x7d & 0xffffffff;
  if (ByteRate < 0x1e848) {
    stprintf_s(Out,OutLen,"%d",uVar1);
    In = " kbit/s";
  }
  else {
    f.Den = 1000;
    f.Num = uVar1;
    FractionToString(Out,OutLen,&f,0,2);
    In = " Mbit/s";
  }
  tcscat_s(Out,OutLen,In);
  return;
}

Assistant:

void ByteRateToString(tchar_t* Out, size_t OutLen, int ByteRate)
{
    int KB = Scale32(ByteRate,8,1000);
    if (KB>=1000)
    {
        cc_fraction f;
        f.Num = KB;
        f.Den = 1000;
        FractionToString(Out,OutLen,&f,0,2);
        tcscat_s(Out,OutLen,T(" Mbit/s"));
    }
    else
    {
        IntToString(Out,OutLen,KB,0);
        tcscat_s(Out,OutLen,T(" kbit/s"));
    }
}